

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<4>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int i_12;
  int iVar11;
  int iVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long *plVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long *plVar25;
  long lVar26;
  long lVar27;
  long *plVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  float fVar37;
  float fVar38;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 bSum;
  Vector<float,_4> res_14;
  deInt64 sy [4];
  deInt64 sx [4];
  Vector<long,_4> e20 [4];
  Vector<long,_4> e12 [4];
  Vector<long,_4> e01 [4];
  float local_338 [4];
  undefined8 local_328;
  undefined8 uStack_320;
  float local_2f8 [12];
  float local_2c8 [20];
  float local_278 [28];
  float local_208 [4];
  long local_1f8 [4];
  long local_1d8 [43];
  Vec4 z0;
  Vector<float,_4> res_10;
  Vec4 z1;
  Vec4 edgeSum;
  Vector<float,_4> res_2;
  
  iVar3 = (this->m_curPos).m_data[1];
  iVar31 = 0;
  if (0 < maxFragmentPackets && iVar3 <= (this->m_bboxMax).m_data[1]) {
    fVar1 = (this->m_v2).m_data[2];
    fVar37 = (this->m_v0).m_data[2] - fVar1;
    fVar38 = (this->m_v1).m_data[2] - fVar1;
    iVar31 = 0;
    do {
      iVar4 = (this->m_curPos).m_data[0];
      iVar15 = iVar4 + 1;
      iVar21 = iVar3 + 1;
      local_1d8[0] = (long)(iVar4 << 8);
      local_1d8[1] = (long)(iVar15 * 0x100);
      local_1d8[2] = (long)(iVar4 << 8);
      local_1d8[3] = (long)(iVar15 * 0x100);
      local_1f8[0] = (long)(iVar3 << 8);
      local_1f8[1] = (long)(iVar3 << 8);
      local_1f8[2] = (long)(iVar21 * 0x100);
      local_1f8[3] = (long)(iVar21 * 0x100);
      iVar11 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
      iVar12 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
      z0.m_data[2] = 0.0;
      z0.m_data[3] = 0.0;
      local_1d8[0x2a] = 0;
      z0.m_data[0] = 0.0;
      z0.m_data[1] = 0.0;
      local_1d8[0x28] = 0;
      local_1d8[0x29] = 0;
      local_1d8[0x26] = 0;
      local_1d8[0x27] = 0;
      local_1d8[0x24] = 0;
      local_1d8[0x25] = 0;
      local_1d8[0x22] = 0;
      local_1d8[0x23] = 0;
      local_1d8[0x20] = 0;
      local_1d8[0x21] = 0;
      local_1d8[0x1e] = 0;
      local_1d8[0x1f] = 0;
      local_1d8[0x1c] = 0;
      local_1d8[0x1d] = 0;
      local_1d8[0x1a] = 0;
      local_1d8[0x1b] = 0;
      local_1d8[0x18] = 0;
      local_1d8[0x19] = 0;
      local_1d8[0x16] = 0;
      local_1d8[0x17] = 0;
      local_1d8[0x14] = 0;
      local_1d8[0x15] = 0;
      local_1d8[0x12] = 0;
      local_1d8[0x13] = 0;
      local_1d8[0x10] = 0;
      local_1d8[0x11] = 0;
      local_1d8[0xe] = 0;
      local_1d8[0xf] = 0;
      local_1d8[0xc] = 0;
      local_1d8[0xd] = 0;
      local_1d8[10] = 0;
      local_1d8[0xb] = 0;
      local_1d8[8] = 0;
      local_1d8[9] = 0;
      local_1d8[6] = 0;
      local_1d8[7] = 0;
      local_1d8[4] = 0;
      local_1d8[5] = 0;
      lVar24 = (this->m_edge01).a;
      lVar30 = (this->m_edge01).b;
      lVar32 = (this->m_edge01).c;
      lVar35 = (this->m_edge12).a;
      lVar5 = (this->m_edge12).b;
      lVar6 = (this->m_edge12).c;
      lVar7 = (this->m_edge20).a;
      lVar8 = (this->m_edge20).b;
      lVar9 = (this->m_edge20).c;
      plVar25 = local_1d8 + 0x24;
      plVar28 = local_1d8 + 0x14;
      plVar19 = local_1d8;
      lVar27 = 0;
      do {
        plVar19 = plVar19 + 4;
        lVar33 = (&s_samplePos4)[lVar27 * 2];
        lVar36 = (&DAT_00b9f978)[lVar27 * 2];
        lVar26 = 0;
        do {
          lVar13 = local_1d8[lVar26] + lVar33;
          lVar22 = local_1f8[lVar26] + lVar36;
          plVar25[lVar26] = lVar30 * lVar22 + lVar24 * lVar13 + lVar32;
          plVar28[lVar26] = lVar5 * lVar22 + lVar35 * lVar13 + lVar6;
          plVar19[lVar26] = lVar22 * lVar8 + lVar13 * lVar7 + lVar9;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 4);
        lVar27 = lVar27 + 1;
        plVar28 = plVar28 + 4;
        plVar25 = plVar25 + 4;
      } while (lVar27 != 4);
      uVar29 = (ulong)(this->m_edge01).inclusive;
      lVar30 = -uVar29;
      uVar23 = (ulong)(this->m_edge12).inclusive;
      lVar24 = -uVar23;
      uVar34 = (ulong)(this->m_edge20).inclusive;
      lVar35 = -uVar34;
      lVar32 = 0x18;
      uVar16 = 0;
      uVar18 = 0;
      do {
        lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x108);
        if ((lVar5 == lVar30 || SBORROW8(lVar5,lVar30) != (long)(lVar5 + uVar29) < 0) ||
           (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x88),
           lVar5 == lVar24 || SBORROW8(lVar5,lVar24) != (long)(lVar5 + uVar23) < 0)) {
          bVar10 = false;
        }
        else {
          lVar5 = *(long *)((long)local_1d8 + lVar32 + 8);
          bVar10 = lVar5 != lVar35 && SBORROW8(lVar5,lVar35) == (long)(lVar5 + uVar34) < 0;
        }
        uVar20 = uVar18 & ~(1L << (uVar16 & 0x3f));
        if (bVar10) {
          uVar20 = uVar18 | 1L << (uVar16 & 0x3f);
        }
        if (((iVar15 == iVar12) ||
            (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x110),
            lVar5 == lVar30 || SBORROW8(lVar5,lVar30) != (long)(lVar5 + uVar29) < 0)) ||
           (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x90),
           lVar5 == lVar24 || SBORROW8(lVar5,lVar24) != (long)(lVar5 + uVar23) < 0)) {
          bVar10 = false;
        }
        else {
          lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x10);
          bVar10 = lVar5 != lVar35 && SBORROW8(lVar5,lVar35) == (long)(lVar5 + uVar34) < 0;
        }
        bVar14 = (byte)uVar16;
        uVar17 = 0x100L << (bVar14 & 0x3f);
        uVar18 = ~uVar17 & uVar20;
        if (bVar10) {
          uVar18 = uVar20 | uVar17;
        }
        if (((iVar21 == iVar11) ||
            (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x118),
            lVar5 == lVar30 || SBORROW8(lVar5,lVar30) != (long)(lVar5 + uVar29) < 0)) ||
           (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x98),
           lVar5 == lVar24 || SBORROW8(lVar5,lVar24) != (long)(lVar5 + uVar23) < 0)) {
          bVar10 = false;
        }
        else {
          lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x18);
          bVar10 = lVar5 != lVar35 && SBORROW8(lVar5,lVar35) == (long)(lVar5 + uVar34) < 0;
        }
        uVar17 = 0x10L << (bVar14 & 0x3f);
        uVar20 = ~uVar17 & uVar18;
        if (bVar10) {
          uVar20 = uVar18 | uVar17;
        }
        if (((iVar21 == iVar11 || iVar15 == iVar12) ||
            (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x120),
            lVar5 == lVar30 || SBORROW8(lVar5,lVar30) != (long)(lVar5 + uVar29) < 0)) ||
           (lVar5 = *(long *)((long)local_1d8 + lVar32 + 0xa0),
           lVar5 == lVar24 || SBORROW8(lVar5,lVar24) != (long)(lVar5 + uVar23) < 0)) {
          bVar10 = false;
        }
        else {
          lVar5 = *(long *)((long)local_1d8 + lVar32 + 0x20);
          bVar10 = lVar5 != lVar35 && SBORROW8(lVar5,lVar35) == (long)(lVar5 + uVar34) < 0;
        }
        uVar17 = 0x1000L << (bVar14 & 0x3f);
        uVar18 = ~uVar17 & uVar20;
        if (bVar10) {
          uVar18 = uVar20 | uVar17;
        }
        uVar16 = uVar16 + 1;
        lVar32 = lVar32 + 0x20;
      } while (uVar16 != 4);
      (this->m_curPos).m_data[0] = iVar4 + 2;
      if ((this->m_bboxMax).m_data[0] < iVar4 + 2) {
        (this->m_curPos).m_data[1] = iVar3 + 2;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      if (uVar18 != 0) {
        if (depthValues != (float *)0x0) {
          plVar19 = local_1d8;
          plVar25 = local_1d8 + 0x14;
          plVar28 = local_1d8 + 0x24;
          lVar24 = 0;
          do {
            plVar19 = plVar19 + 4;
            local_2c8[8] = 0.0;
            local_2c8[9] = 0.0;
            local_2c8[10] = 0.0;
            local_2c8[0xb] = 0.0;
            lVar30 = 0;
            do {
              local_2c8[lVar30 + 8] = (float)plVar28[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            local_2c8[4] = 0.0;
            local_2c8[5] = 0.0;
            local_2c8[6] = 0.0;
            local_2c8[7] = 0.0;
            lVar30 = 0;
            do {
              local_2c8[lVar30 + 4] = (float)plVar25[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            local_2c8[0] = 0.0;
            local_2c8[1] = 0.0;
            local_2c8[2] = 0.0;
            local_2c8[3] = 0.0;
            lVar30 = 0;
            do {
              local_2c8[lVar30] = (float)plVar19[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            local_338[0] = 0.0;
            local_338[1] = 0.0;
            local_338[2] = 0.0;
            local_338[3] = 0.0;
            lVar30 = 0;
            do {
              local_338[lVar30] = local_2c8[lVar30 + 8] + local_2c8[lVar30 + 4];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            local_2f8[4] = 0.0;
            local_2f8[5] = 0.0;
            local_2f8[6] = 0.0;
            local_2f8[7] = 0.0;
            lVar30 = 0;
            do {
              local_2f8[lVar30 + 4] = local_338[lVar30] + local_2c8[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            local_338[0] = 0.0;
            local_338[1] = 0.0;
            local_338[2] = 0.0;
            local_338[3] = 0.0;
            lVar30 = 0;
            do {
              local_338[lVar30] = local_2c8[lVar30 + 4] / local_2f8[lVar30 + 4];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            local_2f8[0] = 0.0;
            local_2f8[1] = 0.0;
            local_2f8[2] = 0.0;
            local_2f8[3] = 0.0;
            lVar30 = 0;
            do {
              local_2f8[lVar30] = local_2c8[lVar30] / local_2f8[lVar30 + 4];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            lVar30 = lVar24 + (iVar31 << 4);
            depthValues[lVar30] = local_338[0] * fVar37 + local_2f8[0] * fVar38 + fVar1;
            depthValues[lVar30 + 4] = local_338[1] * fVar37 + local_2f8[1] * fVar38 + fVar1;
            depthValues[lVar30 + 8] = local_338[2] * fVar37 + local_2f8[2] * fVar38 + fVar1;
            depthValues[lVar30 + 0xc] = local_338[3] * fVar37 + local_2f8[3] * fVar38 + fVar1;
            lVar24 = lVar24 + 1;
            plVar28 = plVar28 + 4;
            plVar25 = plVar25 + 4;
          } while (lVar24 != 4);
        }
        local_2c8[8] = 0.0;
        local_2c8[9] = 0.0;
        local_2c8[10] = 0.0;
        local_2c8[0xb] = 0.0;
        local_2c8[4] = 0.0;
        local_2c8[5] = 0.0;
        local_2c8[6] = 0.0;
        local_2c8[7] = 0.0;
        local_2c8[0] = 0.0;
        local_2c8[1] = 0.0;
        local_2c8[2] = 0.0;
        local_2c8[3] = 0.0;
        lVar24 = (this->m_edge01).a;
        lVar30 = (this->m_edge01).b;
        lVar32 = (this->m_edge01).c;
        lVar35 = (this->m_edge12).a;
        lVar5 = (this->m_edge12).b;
        lVar6 = (this->m_edge12).c;
        lVar7 = (this->m_edge20).a;
        lVar8 = (this->m_edge20).b;
        lVar9 = (this->m_edge20).c;
        lVar27 = 0;
        do {
          lVar36 = *(long *)((long)local_1d8 + lVar27 * 2) + 0x80;
          lVar33 = *(long *)((long)local_1f8 + lVar27 * 2) + 0x80;
          *(float *)((long)local_2c8 + lVar27 + 0x20) =
               (float)(lVar30 * lVar33 + lVar24 * lVar36 + lVar32);
          *(float *)((long)local_2c8 + lVar27 + 0x10) =
               (float)(lVar5 * lVar33 + lVar35 * lVar36 + lVar6);
          *(float *)((long)local_2c8 + lVar27) = (float)(lVar33 * lVar8 + lVar36 * lVar7 + lVar9);
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0x10);
        fVar2 = (this->m_v0).m_data[3];
        local_2f8[4] = 0.0;
        local_2f8[5] = 0.0;
        local_2f8[6] = 0.0;
        local_2f8[7] = 0.0;
        lVar24 = 0;
        do {
          local_2f8[lVar24 + 4] = local_2c8[lVar24 + 4] * fVar2;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        fVar2 = (this->m_v1).m_data[3];
        local_338[0] = 0.0;
        local_338[1] = 0.0;
        local_338[2] = 0.0;
        local_338[3] = 0.0;
        lVar24 = 0;
        do {
          local_338[lVar24] = local_2c8[lVar24] * fVar2;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        fVar2 = (this->m_v2).m_data[3];
        local_2f8[0] = 0.0;
        local_2f8[1] = 0.0;
        local_2f8[2] = 0.0;
        local_2f8[3] = 0.0;
        lVar24 = 0;
        do {
          local_2f8[lVar24] = local_2c8[lVar24 + 8] * fVar2;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        local_328 = 0;
        uStack_320 = 0;
        lVar24 = 0;
        do {
          *(float *)((long)&local_328 + lVar24 * 4) = local_2f8[lVar24 + 4] + local_338[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        local_278[0] = 0.0;
        local_278[1] = 0.0;
        local_278[2] = 0.0;
        local_278[3] = 0.0;
        lVar24 = 0;
        do {
          local_278[lVar24] = *(float *)((long)&local_328 + lVar24 * 4) + local_2f8[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        *(ulong *)fragmentPackets[iVar31].position.m_data = CONCAT44(iVar3,iVar4);
        fragmentPackets[iVar31].coverage = uVar18;
        local_328 = 0;
        uStack_320 = 0;
        lVar24 = 0;
        do {
          *(float *)((long)&local_328 + lVar24 * 4) = local_2f8[lVar24 + 4] / local_278[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        *(undefined8 *)fragmentPackets[iVar31].barycentric[0].m_data = local_328;
        *(undefined8 *)(fragmentPackets[iVar31].barycentric[0].m_data + 2) = uStack_320;
        local_328 = 0;
        uStack_320 = 0;
        lVar24 = 0;
        do {
          *(float *)((long)&local_328 + lVar24 * 4) = local_338[lVar24] / local_278[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        *(undefined8 *)fragmentPackets[iVar31].barycentric[1].m_data = local_328;
        *(undefined8 *)(fragmentPackets[iVar31].barycentric[1].m_data + 2) = uStack_320;
        local_208[0] = 0.0;
        local_208[1] = 0.0;
        local_208[2] = 0.0;
        local_208[3] = 0.0;
        lVar24 = 0;
        do {
          local_208[lVar24] = 1.0 - fragmentPackets[iVar31].barycentric[0].m_data[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        local_328 = 0;
        uStack_320 = 0;
        lVar24 = 0;
        do {
          *(float *)((long)&local_328 + lVar24 * 4) =
               local_208[lVar24] - fragmentPackets[iVar31].barycentric[1].m_data[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        *(undefined8 *)fragmentPackets[iVar31].barycentric[2].m_data = local_328;
        *(undefined8 *)(fragmentPackets[iVar31].barycentric[2].m_data + 2) = uStack_320;
        iVar31 = iVar31 + 1;
      }
      iVar3 = (this->m_curPos).m_data[1];
    } while ((iVar3 <= (this->m_bboxMax).m_data[1]) && (iVar31 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar31;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}